

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

void __thiscall
duckdb::BatchInsertGlobalState::ScheduleMergeTasks
          (BatchInsertGlobalState *this,ClientContext *context,idx_t min_batch_index)

{
  idx_t iVar1;
  pointer pRVar2;
  vector<duckdb::RowGroupBatchEntry,_true> *pvVar3;
  pointer pBVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  undefined4 extraout_var;
  RowGroupCollection *this_00;
  reference pvVar8;
  size_type __n;
  reference pvVar9;
  long lVar10;
  long lVar11;
  InternalException *this_01;
  ulong __n_00;
  ulong uVar12;
  vector<duckdb::RowGroupBatchEntry,_true> *this_02;
  pointer pBVar13;
  allocator local_e1;
  vector<duckdb::RowGroupBatchEntry,_true> *local_e0;
  _Head_base<0UL,_duckdb::BatchInsertTask_*,_false> local_d8;
  ClientContext *local_d0;
  value_type local_c8;
  RowGroupBatchEntry added_entry;
  vector<duckdb::BatchMergeTask,_true> to_be_scheduled_tasks;
  vector<duckdb::RowGroupBatchEntry,_true> merge_collections;
  idx_t merged_batch_index;
  
  to_be_scheduled_tasks.
  super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_be_scheduled_tasks.
  super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  to_be_scheduled_tasks.
  super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.start_index = this->next_start;
  local_c8.end_index = 0;
  local_c8.total_count = 0;
  local_e0 = &this->collections;
  uVar12 = local_c8.start_index;
  local_d0 = context;
LAB_0190029d:
  __n_00 = uVar12;
  if (__n_00 < (ulong)(((long)(this->collections).
                              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              .
                              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->collections).
                             super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                             .
                             super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    pvVar7 = vector<duckdb::RowGroupBatchEntry,_true>::get<true>(local_e0,__n_00);
    if (pvVar7->batch_idx <= min_batch_index) {
      if (pvVar7->type != FLUSHED) goto code_r0x019002d1;
      if (local_c8.total_count != 0) {
        local_c8.end_index = __n_00;
        ::std::vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>::push_back
                  (&to_be_scheduled_tasks.
                    super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>,
                   &local_c8);
      }
      if (this->next_start <= __n_00) {
        this->next_start = __n_00 + 1;
      }
      goto LAB_01900339;
    }
    bVar5 = ReadyToMerge(this,local_c8.total_count);
    if (bVar5) {
      local_c8.end_index = __n_00;
      ::std::vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>::push_back
                (&to_be_scheduled_tasks.
                  super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>,
                 &local_c8);
    }
  }
  pBVar4 = to_be_scheduled_tasks.
           super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
           super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (to_be_scheduled_tasks.
      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_start !=
      to_be_scheduled_tasks.
      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_02 = local_e0;
    for (pBVar13 = to_be_scheduled_tasks.
                   super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                   super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar3 = local_e0, pBVar13 != pBVar4;
        pBVar13 = pBVar13 + 1) {
      pvVar7 = vector<duckdb::RowGroupBatchEntry,_true>::get<true>(this_02,pBVar13->start_index);
      merged_batch_index = pvVar7->batch_idx;
      merge_collections.
      super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      merge_collections.
      super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      merge_collections.
      super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar12 = pBVar13->start_index; uVar12 < pBVar13->end_index; uVar12 = uVar12 + 1) {
        pvVar7 = vector<duckdb::RowGroupBatchEntry,_true>::get<true>(this_02,uVar12);
        if (((pvVar7->collection_index).index == 0xffffffffffffffff) || (pvVar7->type == FLUSHED)) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&added_entry,
                     "Adding a row group collection that should not be flushed",&local_e1);
          InternalException::InternalException(this_01,(string *)&added_entry);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar6 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry._vptr_CatalogEntry[0x10])();
        this_00 = DataTable::GetOptimisticCollection
                            ((DataTable *)CONCAT44(extraout_var,iVar6),local_d0,
                             (PhysicalIndex)(pvVar7->collection_index).index);
        pvVar8 = vector<duckdb::RowGroupBatchEntry,_true>::get<true>(local_e0,pBVar13->start_index);
        added_entry.batch_idx = pvVar8->batch_idx;
        iVar1 = (pvVar7->collection_index).index;
        added_entry.total_rows = RowGroupCollection::GetTotalRows(this_00);
        added_entry.type = FLUSHED;
        added_entry.unflushed_memory = pvVar7->unflushed_memory;
        added_entry.collection_index.index = iVar1;
        ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::
        push_back(&merge_collections.
                   super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                  ,&added_entry);
        pvVar7->total_rows = pBVar13->total_count;
        pvVar7->type = FLUSHED;
        (pvVar7->collection_index).index = 0xffffffffffffffff;
        this_02 = local_e0;
      }
      make_uniq<duckdb::MergeCollectionTask,duckdb::vector<duckdb::RowGroupBatchEntry,true>,unsigned_long&>
                ((duckdb *)&added_entry,&merge_collections,&merged_batch_index);
      local_d8._M_head_impl = (BatchInsertTask *)added_entry.batch_idx;
      added_entry.batch_idx = 0;
      BatchTaskManager<duckdb::BatchInsertTask>::AddTask
                (&this->task_manager,
                 (unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>
                  *)&local_d8);
      if (local_d8._M_head_impl != (BatchInsertTask *)0x0) {
        (*(local_d8._M_head_impl)->_vptr_BatchInsertTask[1])();
      }
      local_d8._M_head_impl = (BatchInsertTask *)0x0;
      if (added_entry.batch_idx != 0) {
        (**(code **)(*(long *)added_entry.batch_idx + 8))();
      }
      ::std::_Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::
      ~_Vector_base((_Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                     *)&merge_collections);
    }
    __n = ((long)to_be_scheduled_tasks.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)to_be_scheduled_tasks.
                super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
    while (__n = __n - 1, __n != 0xffffffffffffffff) {
      pvVar9 = vector<duckdb::BatchMergeTask,_true>::get<true>(&to_be_scheduled_tasks,__n);
      if (pvVar9->start_index + 1 < pvVar9->end_index) {
        local_d0 = (ClientContext *)
                   (pvVar3->
                   super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ).
                   super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar9->start_index);
        pRVar2 = (pvVar3->
                 super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                 ).
                 super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar9->end_index);
        ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::
        erase(&local_e0->
               super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
              ,(RowGroupBatchEntry *)(&local_d0->registered_state + lVar10 * 5),pRVar2 + lVar11);
      }
    }
  }
  ::std::_Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>::
  ~_Vector_base((_Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_> *)
                &to_be_scheduled_tasks);
  return;
code_r0x019002d1:
  local_c8.total_count = local_c8.total_count + pvVar7->total_rows;
  bVar5 = ReadyToMerge(this,local_c8.total_count);
  uVar12 = __n_00 + 1;
  if (bVar5) {
    local_c8.end_index = __n_00 + 1;
    ::std::vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>::push_back
              (&to_be_scheduled_tasks.
                super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>,
               &local_c8);
LAB_01900339:
    local_c8.start_index = __n_00 + 1;
    local_c8.total_count = 0;
    uVar12 = local_c8.start_index;
  }
  goto LAB_0190029d;
}

Assistant:

void BatchInsertGlobalState::ScheduleMergeTasks(ClientContext &context, const idx_t min_batch_index) {
	idx_t current_idx;
	vector<BatchMergeTask> to_be_scheduled_tasks;

	BatchMergeTask current_task(next_start);
	for (current_idx = current_task.start_index; current_idx < collections.size(); current_idx++) {
		auto &entry = collections[current_idx];
		if (entry.batch_idx > min_batch_index) {
			// this entry is AFTER the min_batch_index
			// finished
			if (ReadyToMerge(current_task.total_count)) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			break;
		}
		if (entry.type == RowGroupBatchType::FLUSHED) {
			// already flushed: cannot flush anything here
			if (current_task.total_count > 0) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			current_task.start_index = current_idx + 1;
			if (current_task.start_index > next_start) {
				// avoid checking this segment again in the future
				next_start = current_task.start_index;
			}
			current_task.total_count = 0;
			continue;
		}
		// not flushed - add to set of indexes to flush
		current_task.total_count += entry.total_rows;
		if (ReadyToMerge(current_task.total_count)) {
			// create a task to merge these collections
			current_task.end_index = current_idx + 1;
			to_be_scheduled_tasks.push_back(current_task);
			current_task.start_index = current_idx + 1;
			current_task.total_count = 0;
		}
	}

	if (to_be_scheduled_tasks.empty()) {
		return;
	}
	for (auto &scheduled_task : to_be_scheduled_tasks) {
		D_ASSERT(scheduled_task.total_count > 0);
		D_ASSERT(current_idx > scheduled_task.start_index);
		auto merged_batch_index = collections[scheduled_task.start_index].batch_idx;
		vector<RowGroupBatchEntry> merge_collections;
		for (idx_t idx = scheduled_task.start_index; idx < scheduled_task.end_index; idx++) {
			auto &entry = collections[idx];
			if (!entry.collection_index.IsValid() || entry.type == RowGroupBatchType::FLUSHED) {
				throw InternalException("Adding a row group collection that should not be flushed");
			}
			auto &collection = table.GetStorage().GetOptimisticCollection(context, entry.collection_index);
			RowGroupBatchEntry added_entry(collection, collections[scheduled_task.start_index].batch_idx,
			                               entry.collection_index, RowGroupBatchType::FLUSHED);
			added_entry.unflushed_memory = entry.unflushed_memory;
			merge_collections.push_back(added_entry);
			entry.total_rows = scheduled_task.total_count;
			entry.type = RowGroupBatchType::FLUSHED;
			entry.collection_index = PhysicalIndex(DConstants::INVALID_INDEX);
		}
		task_manager.AddTask(make_uniq<MergeCollectionTask>(std::move(merge_collections), merged_batch_index));
	}
	// erase in reverse order
	for (idx_t i = to_be_scheduled_tasks.size(); i > 0; i--) {
		auto &scheduled_task = to_be_scheduled_tasks[i - 1];
		if (scheduled_task.start_index + 1 < scheduled_task.end_index) {
			// erase all entries except the first one
			collections.erase(collections.begin() + NumericCast<int64_t>(scheduled_task.start_index) + 1,
			                  collections.begin() + NumericCast<int64_t>(scheduled_task.end_index));
		}
	}
}